

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorization.cc
# Opt level: O1

void __thiscall
ipx::LuFactorization::Factorize
          (LuFactorization *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  pointer pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  vector<int,_std::allocator<int>_> *__range1;
  uint nrow;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  allocator_type local_19a;
  bool local_199;
  Vector lhs;
  Vector rhs;
  undefined8 local_178;
  vector<bool,_std::allocator<bool>_> dependent;
  vector<int,_std::allocator<int>_> permuted_row;
  SparseMatrix local_b0;
  
  (*this->_vptr_LuFactorization[2])(SUB84(pivottol,0));
  uVar13 = (long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  iVar12 = (int)(uVar13 >> 2);
  uVar13 = (long)(uVar13 * 0x40000000) >> 0x1d;
  rhs._M_size = (long)iVar12;
  rhs._M_data = (double *)operator_new(uVar13);
  memset(rhs._M_data,0,uVar13);
  lhs._M_size = (long)iVar12;
  lhs._M_data = (double *)operator_new(uVar13);
  memset(lhs._M_data,0,uVar13);
  piVar3 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  InversePerm(&permuted_row,rowperm);
  nrow = (uint)((ulong)((long)piVar3 - (long)piVar4) >> 2);
  local_199 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&dependent,(long)(int)nrow,&local_199,&local_19a)
  ;
  piVar5 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar14 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; piVar14 != piVar5; piVar14 = piVar14 + 1) {
    uVar15 = (ulong)*piVar14;
    uVar13 = uVar15 + 0x3f;
    if (-1 < (long)uVar15) {
      uVar13 = uVar15;
    }
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p
    [((long)uVar13 >> 6) + ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
         dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [((long)uVar13 >> 6) + ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << ((byte)*piVar14 & 0x3f);
  }
  SparseMatrix::SparseMatrix(&local_b0,nrow,0);
  if (0 < (int)nrow) {
    uVar13 = 0;
    do {
      if ((dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
        iVar1 = (colperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13];
        lVar16 = (long)Bbegin[iVar1];
        if (Bbegin[iVar1] < Bend[iVar1]) {
          do {
            SparseMatrix::push_back
                      (&local_b0,
                       permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[Bi[lVar16]],Bx[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < Bend[iVar1]);
        }
      }
      else {
        SparseMatrix::push_back(&local_b0,(Int)uVar13,1.0);
      }
      SparseMatrix::add_column(&local_b0);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (nrow & 0x7fffffff));
  }
  if (dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar7 = Onenorm(&local_b0);
  dVar8 = Infnorm(&local_b0);
  sVar11 = rhs._M_size;
  pdVar10 = lhs._M_data;
  if (lhs._M_size != 0) {
    memset(lhs._M_data,0,lhs._M_size << 3);
  }
  if (0 < (int)(uint)sVar11) {
    piVar3 = (L->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (L->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (L->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      dVar23 = *(double *)(&DAT_003c50a0 + (ulong)(0.0 <= pdVar10[uVar13]) * 8);
      rhs._M_data[uVar13] = dVar23;
      dVar23 = dVar23 + pdVar10[uVar13];
      pdVar10[uVar13] = dVar23;
      iVar1 = piVar3[uVar13];
      lVar16 = (long)iVar1;
      iVar2 = piVar3[uVar13 + 1];
      if (iVar1 < iVar2) {
        do {
          iVar1 = piVar4[lVar16];
          pdVar10[iVar1] = pdVar6[lVar16] * -dVar23 + pdVar10[iVar1];
          lVar16 = lVar16 + 1;
        } while (iVar2 != lVar16);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((uint)sVar11 & 0x7fffffff));
  }
  TriangularSolve(U,&lhs,'n',"upper",0);
  dVar23 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'N');
  dVar9 = Onenorm(&rhs);
  sVar11 = rhs._M_size;
  pdVar10 = lhs._M_data;
  if (lhs._M_size != 0) {
    memset(lhs._M_data,0,lhs._M_size << 3);
  }
  if (0 < (int)(uint)sVar11) {
    piVar3 = (U->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (U->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (U->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      iVar1 = piVar3[uVar13];
      lVar16 = (long)iVar1;
      iVar2 = piVar3[uVar13 + 1];
      dVar19 = 0.0;
      dVar20 = 0.0;
      if (iVar1 < iVar2) {
        do {
          dVar19 = dVar19 + pdVar10[piVar4[lVar16]] * pdVar6[lVar16];
          lVar16 = lVar16 + 1;
          dVar20 = dVar19;
        } while (iVar2 != lVar16);
      }
      dVar19 = pdVar10[uVar13];
      pdVar10[uVar13] = dVar19 - dVar20;
      dVar20 = *(double *)(&DAT_003c50a0 + (ulong)(0.0 <= dVar19 - dVar20) * 8);
      rhs._M_data[uVar13] = dVar20;
      dVar20 = dVar20 + pdVar10[uVar13];
      pdVar10[uVar13] = dVar20;
      pdVar10[uVar13] = dVar20 / pdVar6[(long)iVar2 + -1];
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((uint)sVar11 & 0x7fffffff));
  }
  TriangularSolve(L,&lhs,'t',"lower",1);
  dVar20 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'T');
  dVar19 = Onenorm(&rhs);
  if (local_b0.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar8 = (double)iVar12 + dVar20 * dVar8;
  auVar21._8_8_ = dVar19;
  auVar21._0_8_ = dVar9;
  auVar22._8_4_ = SUB84(dVar8,0);
  auVar22._0_8_ = (double)iVar12 + dVar23 * dVar7;
  auVar22._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar22 = divpd(auVar21,auVar22);
  uVar17 = auVar22._8_4_;
  uVar18 = auVar22._12_4_;
  if (auVar22._8_8_ <= auVar22._0_8_) {
    uVar17 = auVar22._0_4_;
    uVar18 = auVar22._4_4_;
  }
  local_178 = (double)CONCAT44(uVar18,uVar17);
  operator_delete(lhs._M_data);
  operator_delete(rhs._M_data);
  this->stability_ = local_178;
  return;
}

Assistant:

void LuFactorization::Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                                const Int* Bi, const double* Bx,
                                double pivottol, bool strict_abs_pivottol,
                                SparseMatrix* L, SparseMatrix* U,
                                std::vector<Int>* rowperm,
                                std::vector<Int>* colperm,
                                std::vector<Int>* dependent_cols) {
    _Factorize(dim, Bbegin, Bend, Bi, Bx, pivottol, strict_abs_pivottol,
               L, U, rowperm, colperm, dependent_cols);
    stability_ = StabilityEstimate(Bbegin, Bend, Bi, Bx, *L, *U, *rowperm,
                                   *colperm, *dependent_cols);
}